

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

Vec4 __thiscall glcts::BlendOverlay(glcts *this,Vec4 *src,Vec4 *dst)

{
  float fVar1;
  Vec4 VVar2;
  Vec4 rgb;
  Vec4 local_18;
  
  fVar1 = src->m_data[0];
  local_18.m_data[0] = dst->m_data[0];
  if (local_18.m_data[0] <= 0.5) {
    local_18.m_data[0] = (fVar1 + fVar1) * local_18.m_data[0];
  }
  else {
    local_18.m_data[0] = (1.0 - fVar1) * -2.0 * (1.0 - local_18.m_data[0]) + 1.0;
  }
  fVar1 = src->m_data[1];
  local_18.m_data[1] = dst->m_data[1];
  if (local_18.m_data[1] <= 0.5) {
    local_18.m_data[1] = (fVar1 + fVar1) * local_18.m_data[1];
  }
  else {
    local_18.m_data[1] = (1.0 - fVar1) * -2.0 * (1.0 - local_18.m_data[1]) + 1.0;
  }
  fVar1 = src->m_data[2];
  local_18.m_data[2] = dst->m_data[2];
  if (local_18.m_data[2] <= 0.5) {
    local_18.m_data[2] = (fVar1 + fVar1) * local_18.m_data[2];
  }
  else {
    local_18.m_data[2] = (1.0 - fVar1) * -2.0 * (1.0 - local_18.m_data[2]) + 1.0;
  }
  local_18.m_data[3] = 0.0;
  VVar2 = Blend(this,&local_18,src,dst);
  return (Vec4)VVar2.m_data;
}

Assistant:

static tcu::Vec4 BlendOverlay(const tcu::Vec4& src, const tcu::Vec4& dst)
{
	tcu::Vec4 rgb(Overlay(src[0], dst[0]), Overlay(src[1], dst[1]), Overlay(src[2], dst[2]), 0.f);

	return Blend(rgb, src, dst);
}